

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

size_t __thiscall CoreML::Specification::ReverseLayerParams::ByteSizeLong(ReverseLayerParams *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  
  uVar1 = (this->reversedim_).current_size_;
  if ((ulong)uVar1 == 0) {
    uVar3 = 0;
  }
  else if ((int)uVar1 < 0) {
    uVar3 = 0xb;
  }
  else {
    iVar2 = 0x1f;
    if ((uVar1 | 1) != 0) {
      for (; (uVar1 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar3 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
  }
  this->_reversedim_cached_byte_size_ = uVar1;
  sVar4 = uVar3 + uVar1;
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}